

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_starter_test.cpp
# Opt level: O1

int main(void)

{
  test_location<void_(*)()> test;
  SubdirectoryDisposer directory;
  test local_80;
  code *local_48;
  char *pcStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  SubdirectoryDisposer local_30;
  
  local_80.type.data_ = (char *)&local_80.name;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"approval_tests","");
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(&local_30,(string *)&local_80);
  if ((string_view *)local_80.type.data_ != &local_80.name) {
    operator_delete(local_80.type.data_,(ulong)(local_80.name.data_ + 1));
  }
  local_48 = main::anon_class_1_0_00000001::__invoke;
  pcStack_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/examples/ut_starter/ut_starter_test.cpp"
  ;
  local_38 = 0xd;
  local_80.type.data_ = "test";
  local_80.type.size_ = 4;
  local_80.name.data_ = "Starter";
  local_80.name.size_ = 7;
  local_80.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.location._12_4_ = uStack_34;
  test.location.line_ = 0xd;
  test.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/examples/ut_starter/ut_starter_test.cpp"
  ;
  test.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_80,test);
  if (local_80.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(&local_30);
  return 0;
}

Assistant:

int main()
{
    using namespace boost::ut;
    using namespace ApprovalTests;

    // This puts "received" and "approved" files in approval_tests/ sub-directory,
    // keeping the test source directory tidy:
    auto directory = Approvals::useApprovalsSubdirectory("approval_tests");

    "Starter"_test = []() {
        // TODO Replace 42 with the value or object whose contents you are verifying.
        // For help, see:
        // https://approvaltestscpp.readthedocs.io/en/latest/generated_docs/ToString.html
        Approvals::verify(42);
    };
}